

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Cluster::GetLast(Cluster *this,BlockEntry **pLast)

{
  long lVar1;
  long idx;
  long status;
  long len;
  longlong pos;
  BlockEntry **pLast_local;
  Cluster *this_local;
  
  pos = (longlong)pLast;
  pLast_local = (BlockEntry **)this;
  do {
    lVar1 = Parse(this,&len,&status);
    if (lVar1 < 0) {
      *(undefined8 *)pos = 0;
      return lVar1;
    }
  } while (lVar1 < 1);
  if (this->m_entries_count < 1) {
    *(undefined8 *)pos = 0;
  }
  else {
    if (this->m_entries == (BlockEntry **)0x0) {
      __assert_fail("m_entries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1cc9,"long mkvparser::Cluster::GetLast(const BlockEntry *&) const");
    }
    *(BlockEntry **)pos = this->m_entries[this->m_entries_count + -1];
    if (*(long *)pos == 0) {
      __assert_fail("pLast",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1cce,"long mkvparser::Cluster::GetLast(const BlockEntry *&) const");
    }
  }
  return 0;
}

Assistant:

long Cluster::GetLast(const BlockEntry*& pLast) const {
  for (;;) {
    long long pos;
    long len;

    const long status = Parse(pos, len);

    if (status < 0) {  // error
      pLast = NULL;
      return status;
    }

    if (status > 0)  // no new block
      break;
  }

  if (m_entries_count <= 0) {
    pLast = NULL;
    return 0;
  }

  assert(m_entries);

  const long idx = m_entries_count - 1;

  pLast = m_entries[idx];
  assert(pLast);

  return 0;
}